

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_wait_cthread.cpp
# Opt level: O0

__pid_t __thiscall sc_core::wait(sc_core *this,void *__stat_loc)

{
  __pid_t extraout_EAX;
  __pid_t extraout_EAX_00;
  __pid_t _Var1;
  sc_curr_proc_handle psVar2;
  ostream *this_00;
  stringstream msg;
  sc_curr_proc_handle cpi;
  int in_stack_fffffffffffffe1c;
  sc_thread_process *in_stack_fffffffffffffe20;
  string local_1d0 [48];
  stringstream local_1a0 [16];
  ostream local_190 [36];
  int in_stack_fffffffffffffe94;
  char *in_stack_fffffffffffffe98;
  char *in_stack_fffffffffffffea0;
  char *in_stack_fffffffffffffea8;
  sc_severity in_stack_fffffffffffffeb4;
  
  psVar2 = sc_simcontext::get_curr_proc_info((sc_simcontext *)__stat_loc);
  if ((int)this < 1) {
    std::__cxx11::stringstream::stringstream(local_1a0);
    this_00 = std::operator<<(local_190,"n = ");
    std::ostream::operator<<(this_00,(int)this);
    std::__cxx11::stringstream::str();
    in_stack_fffffffffffffe20 = (sc_thread_process *)std::__cxx11::string::c_str();
    sc_report_handler::report
              (in_stack_fffffffffffffeb4,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
               in_stack_fffffffffffffe98,in_stack_fffffffffffffe94);
    std::__cxx11::string::~string(local_1d0);
    std::__cxx11::stringstream::~stringstream(local_1a0);
  }
  if (psVar2->kind == SC_THREAD_PROC_ || psVar2->kind == SC_CTHREAD_PROC_) {
    sc_thread_process::wait_cycles(in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c);
    _Var1 = extraout_EAX;
  }
  else {
    sc_report_handler::report
              (in_stack_fffffffffffffeb4,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
               in_stack_fffffffffffffe98,in_stack_fffffffffffffe94);
    _Var1 = extraout_EAX_00;
  }
  return _Var1;
}

Assistant:

void
wait( int n, sc_simcontext* simc )
{
    sc_curr_proc_handle cpi = simc->get_curr_proc_info();
    if( n <= 0 ) {
        std::stringstream msg;
        msg << "n = " << n;
        SC_REPORT_ERROR( SC_ID_WAIT_N_INVALID_, msg.str().c_str() );
    }
    switch( cpi->kind ) {
      case SC_THREAD_PROC_:
      case SC_CTHREAD_PROC_:
        reinterpret_cast<sc_thread_handle>( cpi->process_handle )->wait_cycles( n );
        break;
      default:
        SC_REPORT_ERROR( SC_ID_WAIT_NOT_ALLOWED_, "\n        "
	                 "in SC_METHODs use next_trigger() instead" );
        break;
    }
}